

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O0

int Gia_ManNodeIfToGia(Gia_Man_t *pNew,If_Man_t *pIfMan,If_Obj_t *pIfObj,Vec_Int_t *vLeaves,
                      int fHash)

{
  int iVar1;
  If_Cut_t *pIVar2;
  If_Cut_t *pIVar3;
  bool bVar4;
  int local_4c;
  int iRes;
  int i;
  If_Obj_t *pLeaf;
  If_Cut_t *pCut;
  int fHash_local;
  Vec_Int_t *vLeaves_local;
  If_Obj_t *pIfObj_local;
  If_Man_t *pIfMan_local;
  Gia_Man_t *pNew_local;
  
  pIVar2 = If_ObjCutBest(pIfObj);
  if (1 < *(uint *)&pIVar2->field_0x1c >> 0x18) {
    local_4c = 0;
    while( true ) {
      bVar4 = false;
      if (local_4c < (int)(*(uint *)&pIVar2->field_0x1c >> 0x18)) {
        _iRes = If_ManObj(pIfMan,(int)(&pIVar2[1].Area)[local_4c]);
        bVar4 = _iRes != (If_Obj_t *)0x0;
      }
      if (!bVar4) break;
      pIVar3 = If_ObjCutBest(_iRes);
      iVar1 = Vec_IntEntry(vLeaves,local_4c);
      If_CutSetDataInt(pIVar3,iVar1);
      local_4c = local_4c + 1;
    }
    Vec_PtrClear(pIfMan->vTemp);
    pNew_local._4_4_ = Gia_ManNodeIfToGia_rec(pNew,pIfMan,pIfObj,pIfMan->vTemp,fHash);
    if (pNew_local._4_4_ == -1) {
      Abc_Print(-1,"Gia_ManNodeIfToGia(): Computing local AIG has failed.\n");
      pNew_local._4_4_ = -1;
    }
    else {
      local_4c = 0;
      while( true ) {
        bVar4 = false;
        if (local_4c < (int)(*(uint *)&pIVar2->field_0x1c >> 0x18)) {
          _iRes = If_ManObj(pIfMan,(int)(&pIVar2[1].Area)[local_4c]);
          bVar4 = _iRes != (If_Obj_t *)0x0;
        }
        if (!bVar4) break;
        pIVar3 = If_ObjCutBest(_iRes);
        If_CutSetDataInt(pIVar3,0);
        local_4c = local_4c + 1;
      }
      for (local_4c = 0; iVar1 = Vec_PtrSize(pIfMan->vTemp), local_4c < iVar1;
          local_4c = local_4c + 1) {
        pIVar2 = (If_Cut_t *)Vec_PtrEntry(pIfMan->vTemp,local_4c);
        If_CutSetDataInt(pIVar2,0);
      }
    }
    return pNew_local._4_4_;
  }
  __assert_fail("pCut->nLeaves > 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIf.c"
                ,0x580,
                "int Gia_ManNodeIfToGia(Gia_Man_t *, If_Man_t *, If_Obj_t *, Vec_Int_t *, int)");
}

Assistant:

int Gia_ManNodeIfToGia( Gia_Man_t * pNew, If_Man_t * pIfMan, If_Obj_t * pIfObj, Vec_Int_t * vLeaves, int fHash )
{
    If_Cut_t * pCut;
    If_Obj_t * pLeaf;
    int i, iRes;
    // get the best cut
    pCut = If_ObjCutBest(pIfObj);
    assert( pCut->nLeaves > 1 );
    // set the leaf variables
    If_CutForEachLeaf( pIfMan, pCut, pLeaf, i )
        If_CutSetDataInt( If_ObjCutBest(pLeaf), Vec_IntEntry(vLeaves, i) );
    // recursively compute the function while collecting visited cuts
    Vec_PtrClear( pIfMan->vTemp );
    iRes = Gia_ManNodeIfToGia_rec( pNew, pIfMan, pIfObj, pIfMan->vTemp, fHash ); 
    if ( iRes == ~0 )
    {
        Abc_Print( -1, "Gia_ManNodeIfToGia(): Computing local AIG has failed.\n" );
        return ~0;
    }
    // clean the cuts
    If_CutForEachLeaf( pIfMan, pCut, pLeaf, i )
        If_CutSetDataInt( If_ObjCutBest(pLeaf), 0 );
    Vec_PtrForEachEntry( If_Cut_t *, pIfMan->vTemp, pCut, i )
        If_CutSetDataInt( pCut, 0 );
    return iRes;
}